

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

int __thiscall ncnn::Layer::forward(Layer *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *in_R8;
  Mat local_60;
  
  if (this->support_inplace == true) {
    Mat::clone(&local_60,(__fn *)bottom_blob,opt->blob_allocator,(int)opt,in_R8);
    Mat::operator=(top_blob,&local_60);
    Mat::~Mat(&local_60);
    iVar1 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar1 = (*this->_vptr_Layer[9])(this,top_blob,opt);
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Layer::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blob = bottom_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    return forward_inplace(top_blob, opt);
}